

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>>::
emplace<QModelIndex&,QSortFilterProxyModelPrivate::Mapping*&>
          (QMovableArrayOps<std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>> *this,
          qsizetype i,QModelIndex *args,Mapping **args_1)

{
  int iVar1;
  int iVar2;
  long lVar3;
  quintptr qVar4;
  QAbstractItemModel *pQVar5;
  Mapping *pMVar6;
  qsizetype qVar7;
  long lVar8;
  long in_FS_OFFSET;
  Inserter local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this == (int *)0x0) || (1 < **(int **)this)) goto LAB_0042e18e;
  if (*(long *)(this + 0x10) == i) {
    qVar7 = QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
            freeSpaceAtEnd((QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                            *)this);
    if (qVar7 == 0) goto LAB_0042e185;
    lVar3 = *(long *)(this + 8);
    lVar8 = *(long *)(this + 0x10) * 0x20;
    *(QAbstractItemModel **)(lVar3 + 0x10 + lVar8) = (args->m).ptr;
    qVar4 = args->i;
    *(undefined8 *)(lVar3 + lVar8) = *(undefined8 *)args;
    ((undefined8 *)(lVar3 + lVar8))[1] = qVar4;
    *(Mapping **)(lVar3 + 0x18 + lVar8) = *args_1;
  }
  else {
LAB_0042e185:
    if (i == 0) {
      qVar7 = QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
              freeSpaceAtBegin((QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                                *)this);
      if (qVar7 == 0) goto LAB_0042e18e;
      lVar3 = *(long *)(this + 8);
      *(QAbstractItemModel **)(lVar3 + -0x10) = (args->m).ptr;
      qVar4 = args->i;
      *(undefined8 *)(lVar3 + -0x20) = *(undefined8 *)args;
      *(quintptr *)(lVar3 + -0x18) = qVar4;
      *(Mapping **)(lVar3 + -8) = *args_1;
    }
    else {
LAB_0042e18e:
      iVar1 = args->r;
      iVar2 = args->c;
      qVar4 = args->i;
      pQVar5 = (args->m).ptr;
      pMVar6 = *args_1;
      lVar3 = *(long *)(this + 0x10);
      QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
      detachAndGrow((QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                     *)this,(uint)(i == 0 && lVar3 != 0),1,
                    (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> **)0x0,
                    (QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                     *)0x0);
      if (i != 0 || lVar3 == 0) {
        QMovableArrayOps<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::Inserter
        ::Inserter(&local_60,
                   (QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                    *)this,i,1);
        ((local_60.displaceFrom)->first).r = iVar1;
        ((local_60.displaceFrom)->first).c = iVar2;
        ((local_60.displaceFrom)->first).i = qVar4;
        ((local_60.displaceFrom)->first).m.ptr = pQVar5;
        (local_60.displaceFrom)->second = pMVar6;
        (local_60.data)->size = (local_60.data)->size + local_60.nInserts;
        goto LAB_0042e246;
      }
      lVar3 = *(long *)(this + 8);
      *(int *)(lVar3 + -0x20) = iVar1;
      *(int *)(lVar3 + -0x1c) = iVar2;
      *(quintptr *)(lVar3 + -0x18) = qVar4;
      *(QAbstractItemModel **)(lVar3 + -0x10) = pQVar5;
      *(Mapping **)(lVar3 + -8) = pMVar6;
    }
    *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
  }
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
LAB_0042e246:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }